

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall pg::Game::write_dot(Game *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  int i;
  int vertex;
  long lVar5;
  
  poVar2 = std::operator<<(out,"digraph G {");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar5 = 0; lVar5 < this->n_vertices; lVar5 = lVar5 + 1) {
    vertex = (int)lVar5;
    poVar2 = (ostream *)std::ostream::operator<<(out,vertex);
    poVar2 = std::operator<<(poVar2," [ shape=\"");
    iVar1 = owner(this,vertex);
    pcVar4 = "box";
    if (iVar1 == 0) {
      pcVar4 = "diamond";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"\", label=\"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->_priority[lVar5]);
    poVar2 = std::operator<<(poVar2,"\"];");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (piVar3 = this->_outedges + this->_firstouts[lVar5]; *piVar3 != -1; piVar3 = piVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(out,vertex);
      poVar2 = std::operator<<(poVar2," -> ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
      poVar2 = std::operator<<(poVar2,";");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  poVar2 = std::operator<<(out,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
Game::write_dot(std::ostream &out)
{
    out << "digraph G {" << std::endl;
    for (int i=0; i<n_vertices; i++) {
        out << i << " [ shape=\"" << (owner(i) ? "box" : "diamond")
            << "\", label=\"" << priority(i) << "\"];" << std::endl;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            out << i << " -> " << (*curedge) << ";" << std::endl;
        }
    }
    out << "}" << std::endl;
}